

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

VRle __thiscall VRle::opGeneric(VRle *this,VRle *o,Op op)

{
  model *pmVar1;
  model *pmVar2;
  Data *pDVar3;
  Op in_ECX;
  size_t __n;
  undefined4 in_register_00000014;
  int __fd;
  Data *aObj;
  undefined1 auVar4 [16];
  
  __n = (size_t)in_ECX;
  pmVar1 = (o->d).mModel;
  pmVar2 = *(model **)CONCAT44(in_register_00000014,op);
  if ((pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pmVar1->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->d).mModel = pmVar2;
    LOCK();
    (pmVar2->mRef).super___atomic_base<unsigned_long>._M_i =
         (pmVar2->mRef).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else if ((pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           (pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
    (this->d).mModel = pmVar1;
    LOCK();
    (pmVar1->mRef).super___atomic_base<unsigned_long>._M_i =
         (pmVar1->mRef).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else {
    pDVar3 = (Data *)_ZTWL14Scratch_Object();
    Data::reset(pDVar3);
    pDVar3 = (Data *)_ZTWL14Scratch_Object();
    aObj = &((o->d).mModel)->mValue;
    Data::opGeneric(pDVar3,aObj,(Data *)(*(long *)CONCAT44(in_register_00000014,op) + 8),in_ECX);
    __fd = (int)aObj;
    vcow_ptr<VRle::Data>::vcow_ptr(&this->d);
    auVar4 = _ZTWL14Scratch_Object();
    pDVar3 = (Data *)vcow_ptr<VRle::Data>::write(&this->d,__fd,auVar4._8_8_,__n);
    Data::operator=(pDVar3,auVar4._0_8_);
  }
  return (VRle)(vcow_ptr<VRle::Data>)this;
}

Assistant:

VRle VRle::opGeneric(const VRle &o, Data::Op op) const
{
    if (empty()) return o;
    if (o.empty()) return *this;

    Scratch_Object.reset();
    Scratch_Object.opGeneric(d.read(), o.d.read(), op);

    VRle result;
    result.d.write() = Scratch_Object;

    return result;
}